

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# firstpass_test.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_120a2c6::FirstpassTest_FirstpassInfoInitWithExtBuf_Test::TestBody
          (FirstpassTest_FirstpassInfoInitWithExtBuf_Test *this)

{
  bool bVar1;
  undefined1 uVar2;
  AssertHelper *this_00;
  AssertionResult gtest_ar_3;
  AssertionResult gtest_ar_2;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  aom_codec_err_t ret;
  int i;
  int ref_stats_size;
  FIRSTPASS_STATS ext_stats_buf [10];
  FIRSTPASS_INFO firstpass_info;
  int in_stack_ffffffffffffc85c;
  FIRSTPASS_STATS *in_stack_ffffffffffffc860;
  FIRSTPASS_INFO *in_stack_ffffffffffffc868;
  AssertionResult *this_01;
  undefined7 in_stack_ffffffffffffc870;
  undefined1 in_stack_ffffffffffffc877;
  char *in_stack_ffffffffffffc878;
  int line;
  char *in_stack_ffffffffffffc880;
  AssertionResult *this_02;
  Type in_stack_ffffffffffffc88c;
  Type type;
  AssertHelper *in_stack_ffffffffffffc890;
  Message *in_stack_ffffffffffffc8d8;
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  in_stack_ffffffffffffc8e0;
  AssertionResult local_3700 [2];
  int local_36dc;
  AssertionResult local_36d8 [3];
  AssertionResult local_36a8;
  aom_codec_err_t local_3694;
  int local_3690;
  undefined4 local_368c;
  double local_3688 [1714];
  int local_f8;
  int local_f4;
  
  local_368c = 10;
  for (local_3690 = 0; local_3690 < 10; local_3690 = local_3690 + 1) {
    memset(local_3688 + (long)local_3690 * 0x1d,0,0xe8);
    local_3688[(long)local_3690 * 0x1d] = (double)local_3690;
  }
  local_3694 = av1_firstpass_info_init
                         (in_stack_ffffffffffffc868,in_stack_ffffffffffffc860,
                          in_stack_ffffffffffffc85c);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffc878,
             (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870),
             (int *)in_stack_ffffffffffffc868,(int *)in_stack_ffffffffffffc860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(&local_36a8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffc890);
    testing::AssertionResult::failure_message((AssertionResult *)0xb46e44);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffc890,in_stack_ffffffffffffc88c,in_stack_ffffffffffffc880,
               (int)((ulong)in_stack_ffffffffffffc878 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffc8e0._M_head_impl,in_stack_ffffffffffffc8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffc860);
    testing::Message::~Message((Message *)0xb46ea1);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb46ef6);
  local_36dc = local_f8 + local_f4;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffc878,
             (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870),
             (int *)in_stack_ffffffffffffc868,(int *)in_stack_ffffffffffffc860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(local_36d8);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffc890);
    in_stack_ffffffffffffc890 =
         (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb46fa3);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffc890,in_stack_ffffffffffffc88c,in_stack_ffffffffffffc880,
               (int)((ulong)in_stack_ffffffffffffc878 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffc8e0._M_head_impl,in_stack_ffffffffffffc8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffc860);
    testing::Message::~Message((Message *)0xb47000);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb47055);
  this_02 = local_3700;
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffc878,
             (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870),
             (int *)in_stack_ffffffffffffc868,(int *)in_stack_ffffffffffffc860);
  bVar1 = testing::AssertionResult::operator_cast_to_bool(this_02);
  type = CONCAT13(bVar1,(int3)in_stack_ffffffffffffc88c);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffc890);
    in_stack_ffffffffffffc878 =
         testing::AssertionResult::failure_message((AssertionResult *)0xb470f6);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffc890,type,&this_02->success_,
               (int)((ulong)in_stack_ffffffffffffc878 >> 0x20),
               (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffc8e0._M_head_impl,in_stack_ffffffffffffc8d8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)in_stack_ffffffffffffc860);
    testing::Message::~Message((Message *)0xb47153);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb471a8);
  this_01 = (AssertionResult *)&stack0xffffffffffffc8d8;
  testing::internal::EqHelper::Compare<aom_codec_err_t,_aom_codec_err_t,_nullptr>
            (in_stack_ffffffffffffc878,
             (char *)CONCAT17(in_stack_ffffffffffffc877,in_stack_ffffffffffffc870),
             (aom_codec_err_t *)this_01,(aom_codec_err_t *)in_stack_ffffffffffffc860);
  line = (int)((ulong)in_stack_ffffffffffffc878 >> 0x20);
  uVar2 = testing::AssertionResult::operator_cast_to_bool(this_01);
  if (!(bool)uVar2) {
    testing::Message::Message((Message *)in_stack_ffffffffffffc890);
    this_00 = (AssertHelper *)testing::AssertionResult::failure_message((AssertionResult *)0xb47240)
    ;
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffc890,type,&this_02->success_,line,
               (char *)CONCAT17(uVar2,in_stack_ffffffffffffc870));
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)in_stack_ffffffffffffc8e0._M_head_impl,in_stack_ffffffffffffc8d8);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0xb4728e);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0xb472dd);
  return;
}

Assistant:

TEST(FirstpassTest, FirstpassInfoInitWithExtBuf) {
  FIRSTPASS_INFO firstpass_info;
  FIRSTPASS_STATS ext_stats_buf[10];
  const int ref_stats_size = 10;
  for (int i = 0; i < ref_stats_size; ++i) {
    av1_zero(ext_stats_buf[i]);
    ext_stats_buf[i].frame = i;
  }
  aom_codec_err_t ret =
      av1_firstpass_info_init(&firstpass_info, ext_stats_buf, 10);
  EXPECT_EQ(firstpass_info.stats_count, ref_stats_size);
  EXPECT_EQ(firstpass_info.future_stats_count + firstpass_info.past_stats_count,
            firstpass_info.stats_count);
  EXPECT_EQ(firstpass_info.cur_index, 0);
  EXPECT_EQ(ret, AOM_CODEC_OK);
}